

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O3

void __thiscall t_ocaml_generator::generate_service(t_ocaml_generator *this,t_service *tservice)

{
  _func_int **pp_Var1;
  ofstream_with_content_based_conditional_update *this_00;
  ofstream_with_content_based_conditional_update *this_01;
  ulong uVar2;
  _func_int **pp_Var3;
  pointer pcVar4;
  undefined4 uVar5;
  _func_int **pp_Var6;
  _Base_ptr p_Var7;
  int iVar8;
  undefined8 *puVar9;
  long *plVar10;
  ostream *poVar11;
  _Rb_tree_node_base *p_Var12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  t_ocaml_generator *this_02;
  _Alloc_hider _Var14;
  undefined8 uVar15;
  ulong uVar16;
  string f_service_i_name;
  string f_service_name;
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Rb_tree_node_base *local_138;
  _Base_ptr local_130;
  undefined1 local_128 [16];
  _Alloc_hider local_118;
  _Base_ptr local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  _func_int **local_f0;
  undefined1 local_e8 [16];
  _Alloc_hider _Stack_d8;
  _func_int **local_d0;
  undefined1 local_c8 [16];
  _Base_ptr p_Stack_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  undefined1 local_a0 [16];
  _Rb_tree_node_base *local_90;
  _Base_ptr local_88;
  _Rb_tree_node_base local_80;
  _Rb_tree_node_base local_60;
  ulong local_40;
  _Base_ptr p_Stack_38;
  
  local_f8._M_p = (pointer)tservice;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_158,this);
  pcVar4 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,
             pcVar4 + (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
            );
  p_Var12 = local_90;
  iVar8 = toupper((int)(char)local_90->_M_color);
  *(char *)&p_Var12->_M_color = (char)iVar8;
  p_Var7 = local_88;
  uVar5 = local_128._7_4_;
  local_128[7] = local_80._7_1_;
  if (local_90 == &local_80) {
    local_128._0_7_ = (undefined7)CONCAT71(local_80._1_7_,(undefined1)local_80._M_color);
    local_128._8_3_ = SUB83(local_80._M_parent,0);
    local_128[0xb] = (undefined1)((ulong)local_80._M_parent >> 0x18);
    local_128._12_4_ = (undefined4)((ulong)local_80._M_parent >> 0x20);
    local_138 = (_Rb_tree_node_base *)local_128;
  }
  else {
    local_128._0_7_ = (undefined7)CONCAT71(local_80._1_7_,(undefined1)local_80._M_color);
    local_128._8_3_ = SUB43(uVar5,1);
    local_138 = local_90;
  }
  local_130 = local_88;
  local_88 = (_Base_ptr)0x0;
  local_80._M_color._0_1_ = _S_red;
  pp_Var3 = (_func_int **)(local_158 + 0x10);
  uVar2 = (long)&p_Var7->_M_color + local_158._8_8_;
  uVar15 = 0xf;
  if ((_func_int **)local_158._0_8_ != pp_Var3) {
    uVar15 = local_148._M_allocated_capacity;
  }
  if ((ulong)uVar15 < uVar2) {
    uVar16 = 0xf;
    if (local_138 != (_Rb_tree_node_base *)local_128) {
      uVar16 = CONCAT17(local_128[7],local_128._0_7_);
    }
    if (uVar16 < uVar2) goto LAB_002dfb9f;
    local_90 = &local_80;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,local_158._0_8_);
  }
  else {
LAB_002dfb9f:
    local_90 = &local_80;
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append(local_158,(ulong)local_138);
  }
  local_118._M_p = (pointer)&local_108;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 == paVar13) {
    local_108._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_108._8_8_ = puVar9[3];
  }
  else {
    local_108._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_118._M_p = (pointer)*puVar9;
  }
  local_110 = (_Base_ptr)puVar9[1];
  *puVar9 = paVar13;
  puVar9[1] = 0;
  paVar13->_M_local_buf[0] = '\0';
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_118);
  this_02 = (t_ocaml_generator *)local_158;
  local_80._M_left = &local_60;
  p_Var12 = (_Rb_tree_node_base *)(plVar10 + 2);
  if ((_Rb_tree_node_base *)*plVar10 == p_Var12) {
    local_60._0_8_ = *(undefined8 *)p_Var12;
    local_60._M_parent = (_Base_ptr)plVar10[3];
  }
  else {
    local_60._0_8_ = *(undefined8 *)p_Var12;
    local_80._M_left = (_Rb_tree_node_base *)*plVar10;
  }
  local_80._M_right = (_Base_ptr)plVar10[1];
  *plVar10 = (long)p_Var12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p);
  }
  if (local_138 != (_Rb_tree_node_base *)local_128) {
    operator_delete(local_138);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((_func_int **)local_158._0_8_ != pp_Var3) {
    operator_delete((void *)local_158._0_8_);
  }
  std::__cxx11::string::string((string *)&local_118,(char *)local_80._M_left,(allocator *)local_158)
  ;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_service_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  this_00 = &this->f_service_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_service_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_138,this);
  pcVar4 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  local_b0 = (_Base_ptr)local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar4,
             pcVar4 + (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
            );
  p_Var7 = local_b0;
  iVar8 = toupper((int)(char)local_b0->_M_color);
  *(char *)&p_Var7->_M_color = (char)iVar8;
  p_Var7 = local_a8;
  if (local_b0 == (_Base_ptr)local_a0) {
    p_Stack_38 = (_Base_ptr)local_a0._8_8_;
    local_b0 = (_Base_ptr)&local_40;
  }
  local_40 = CONCAT71(local_a0._1_7_,local_a0[0]);
  local_60._M_right = local_a8;
  local_a8 = (_Base_ptr)0x0;
  local_a0[0] = _S_red;
  uVar2 = (long)&p_Var7->_M_color + (long)&local_130->_M_color;
  uVar16 = 0xf;
  if (local_138 != (_Rb_tree_node_base *)local_128) {
    uVar16 = CONCAT17(local_128[7],local_128._0_7_);
  }
  local_60._M_left = local_b0;
  if (uVar16 < uVar2) {
    uVar16 = 0xf;
    if (local_b0 != (_Base_ptr)&local_40) {
      uVar16 = local_40;
    }
    if (uVar2 <= uVar16) {
      local_b0 = (_Base_ptr)local_a0;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_60._M_left,0,(char *)0x0,(ulong)local_138);
      goto LAB_002dfdf9;
    }
  }
  local_b0 = (_Base_ptr)local_a0;
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_60._M_left)
  ;
LAB_002dfdf9:
  local_158._0_8_ = local_158 + 0x10;
  pp_Var1 = (_func_int **)(puVar9 + 2);
  if ((_func_int **)*puVar9 == pp_Var1) {
    local_148._M_allocated_capacity = (size_type)*pp_Var1;
    local_148._8_8_ = puVar9[3];
  }
  else {
    local_148._M_allocated_capacity = (size_type)*pp_Var1;
    local_158._0_8_ = (_func_int **)*puVar9;
  }
  local_158._8_8_ = puVar9[1];
  *puVar9 = pp_Var1;
  puVar9[1] = 0;
  *(char *)pp_Var1 = '\0';
  plVar10 = (long *)std::__cxx11::string::append(local_158);
  local_118._M_p = (pointer)&local_108;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar13) {
    local_108._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_108._8_8_ = plVar10[3];
  }
  else {
    local_108._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_118._M_p = (pointer)*plVar10;
  }
  local_110 = (_Base_ptr)plVar10[1];
  *plVar10 = (long)paVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((_func_int **)local_158._0_8_ != pp_Var3) {
    operator_delete((void *)local_158._0_8_);
  }
  if (local_60._M_left != (_Base_ptr)&local_40) {
    operator_delete(local_60._M_left);
  }
  if (local_b0 != (_Base_ptr)local_a0) {
    operator_delete(local_b0);
  }
  if (local_138 != (_Rb_tree_node_base *)local_128) {
    operator_delete(local_138);
  }
  std::__cxx11::string::string((string *)local_158,local_118._M_p,(allocator *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_service_i_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  this_01 = &this->f_service_i_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_01);
  (this->f_service_i_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((_func_int **)local_158._0_8_ != pp_Var3) {
    operator_delete((void *)local_158._0_8_);
  }
  ocaml_autogen_comment_abi_cxx11_((string *)local_158,this_02);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,(char *)local_158._0_8_,local_158._8_8_);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  local_128._0_7_ = 0x6854206e65706f;
  local_128._7_4_ = 0x74666972;
  local_130 = (_Base_ptr)0xb;
  local_128[0xb] = 0;
  local_138 = (_Rb_tree_node_base *)local_128;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_128,0xb);
  _Var14 = ::endl_abi_cxx11_._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_138 != (_Rb_tree_node_base *)local_128) {
    operator_delete(local_138);
  }
  if ((_func_int **)local_158._0_8_ != pp_Var3) {
    operator_delete((void *)local_158._0_8_);
  }
  ocaml_autogen_comment_abi_cxx11_((string *)local_158,(t_ocaml_generator *)_Var14._M_p);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,(char *)local_158._0_8_,local_158._8_8_);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  local_128._0_7_ = 0x6854206e65706f;
  local_128._7_4_ = 0x74666972;
  local_130 = (_Base_ptr)0xb;
  local_128[0xb] = 0;
  local_138 = (_Rb_tree_node_base *)local_128;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)local_128,0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_138 != (_Rb_tree_node_base *)local_128) {
    operator_delete(local_138);
  }
  if ((_func_int **)local_158._0_8_ != pp_Var3) {
    operator_delete((void *)local_158._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"open ",5);
  pp_Var1 = (_func_int **)(local_c8 + 8);
  pcVar4 = (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus._M_p;
  local_d0 = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar4,
             pcVar4 + (this->super_t_oop_generator).super_t_generator.program_name_._M_string_length
            );
  pp_Var6 = local_d0;
  iVar8 = toupper((int)*(char *)local_d0);
  *(char *)pp_Var6 = (char)iVar8;
  uVar15 = local_c8._0_8_;
  if (local_d0 == pp_Var1) {
    local_148._8_8_ = p_Stack_b8;
    local_d0 = pp_Var3;
  }
  local_158._8_8_ = local_c8._0_8_;
  local_c8._0_8_ = 0;
  local_c8[8] = '\0';
  local_158._0_8_ = local_d0;
  pp_Var6 = local_d0;
  local_d0 = pp_Var1;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,(char *)pp_Var6,uVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_types",6);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((_func_int **)local_158._0_8_ != pp_Var3) {
    operator_delete((void *)local_158._0_8_);
  }
  if (local_d0 != pp_Var1) {
    operator_delete(local_d0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"open ",5);
  pp_Var3 = (_func_int **)(local_e8 + 8);
  pcVar4 = (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus._M_p;
  local_f0 = pp_Var3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar4,
             pcVar4 + (this->super_t_oop_generator).super_t_generator.program_name_._M_string_length
            );
  pp_Var1 = local_f0;
  iVar8 = toupper((int)*(char *)local_f0);
  *(char *)pp_Var1 = (char)iVar8;
  uVar15 = local_e8._0_8_;
  if (local_f0 == pp_Var3) {
    local_148._8_8_ = _Stack_d8._M_p;
    local_f0 = (_func_int **)(local_158 + 0x10);
  }
  local_158._8_8_ = local_e8._0_8_;
  local_e8._0_8_ = 0;
  local_e8[8] = '\0';
  local_158._0_8_ = local_f0;
  pp_Var1 = local_f0;
  local_f0 = pp_Var3;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,(char *)pp_Var1,uVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_types",6);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_);
  }
  if (local_f0 != pp_Var3) {
    operator_delete(local_f0);
  }
  generate_service_helpers(this,(t_service *)local_f8._M_p);
  generate_service_interface(this,(t_service *)local_f8._M_p);
  generate_service_client(this,(t_service *)local_f8._M_p);
  _Var14._M_p = local_f8._M_p;
  generate_service_server(this,(t_service *)local_f8._M_p);
  iVar8 = (int)_Var14._M_p;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,iVar8);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_01,iVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p);
  }
  if (local_80._M_left != &local_60) {
    operator_delete(local_80._M_left);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_service(t_service* tservice) {
  string f_service_name = get_out_dir() + capitalize(service_name_) + ".ml";
  f_service_.open(f_service_name.c_str());
  string f_service_i_name = get_out_dir() + capitalize(service_name_) + ".mli";
  f_service_i_.open(f_service_i_name.c_str());

  f_service_ << ocaml_autogen_comment() << endl << ocaml_imports() << endl;
  f_service_i_ << ocaml_autogen_comment() << endl << ocaml_imports() << endl;

  /* if (tservice->get_extends() != nullptr) {
    f_service_ <<
      "open " << capitalize(tservice->get_extends()->get_name()) << endl;
    f_service_i_ <<
      "open " << capitalize(tservice->get_extends()->get_name()) << endl;
  }
  */
  f_service_ << "open " << capitalize(program_name_) << "_types" << endl << endl;

  f_service_i_ << "open " << capitalize(program_name_) << "_types" << endl << endl;

  // Generate the three main parts of the service
  generate_service_helpers(tservice);
  generate_service_interface(tservice);
  generate_service_client(tservice);
  generate_service_server(tservice);

  // Close service file
  f_service_.close();
  f_service_i_.close();
}